

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

ON_wString __thiscall
ON_wString::EncodeXMLValue(ON_wString *this,bool bEncodeCodePointsAboveBasicLatin)

{
  wchar_t *pwVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t hex_digit_count;
  ON_Internal_Empty_wString *pOVar7;
  wchar_t *pwVar8;
  uint uVar9;
  ON__UINT32 OVar10;
  byte in_DL;
  long lVar11;
  uint uVar12;
  wchar_t wVar13;
  undefined7 in_register_00000031;
  wchar_t *buffer1;
  wchar_t *sWideChar;
  ulong uVar14;
  ON_wString *pOVar15;
  ulong uVar16;
  ON_wString s;
  ON__UINT32 u_1;
  ON_UnicodeErrorParameters e;
  uint hex_digits [8];
  ON_wString local_88;
  ON__UINT32 local_7c;
  ON_wString *local_78;
  ON_UnicodeErrorParameters local_70;
  undefined8 local_60;
  uint local_58 [10];
  
  sWideChar = ((ON_wString *)CONCAT71(in_register_00000031,bEncodeCodePointsAboveBasicLatin))->m_s;
  pOVar7 = (ON_Internal_Empty_wString *)(sWideChar + -3);
  if (sWideChar == (wchar_t *)0x0) {
    pOVar7 = &empty_wstring;
  }
  iVar5 = (pOVar7->header).string_length;
  if ((((long)iVar5 < 1) || (sWideChar == (wchar_t *)0x0)) || ((pOVar7->header).string_capacity < 1)
     ) {
    pOVar15 = &EmptyString;
  }
  else {
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    pwVar1 = sWideChar + iVar5;
    uVar12 = 0;
    pwVar8 = sWideChar;
    local_78 = this;
    local_60 = (ON_wString *)CONCAT71(in_register_00000031,bEncodeCodePointsAboveBasicLatin);
    do {
      wVar13 = *pwVar8;
      if (wVar13 < L'\'') {
        if (wVar13 == L'\"') goto LAB_00682367;
        if (wVar13 != L'&') goto LAB_0068237d;
        uVar9 = uVar12 + 4;
      }
      else if (wVar13 == L'\'') {
LAB_00682367:
        uVar9 = uVar12 + 5;
      }
      else if ((wVar13 == L'<') || (wVar13 == L'>')) {
        uVar9 = uVar12 + 3;
      }
      else {
LAB_0068237d:
        uVar9 = uVar12;
        if (0x7f < (uint)wVar13 && (in_DL ^ 1) == 0) {
          local_70.m_error_code_point = ON_UnicodeErrorParameters::MaskErrors.m_error_code_point;
          local_70.m_error_status = ON_UnicodeErrorParameters::MaskErrors.m_error_status;
          local_70.m_error_mask = ON_UnicodeErrorParameters::MaskErrors.m_error_mask;
          local_88.m_s._0_4_ = 0xfffd;
          iVar6 = ON_DecodeWideChar(pwVar8,(int)((ulong)((long)pwVar1 - (long)pwVar8) >> 2),
                                    &local_70,(ON__UINT32 *)&local_88);
          if ((0 < iVar6) && (iVar4 = ON_IsValidUnicodeCodePoint((uint)local_88.m_s), iVar4 != 0)) {
            uVar16 = 0;
            uVar9 = (uint)local_88.m_s;
            do {
              if (uVar16 == 8) {
                uVar16 = 0;
                break;
              }
              local_58[uVar16] = uVar9 & 0xf;
              uVar16 = uVar16 + 1;
              bVar2 = 0xf < uVar9;
              uVar9 = uVar9 >> 4;
            } while (bVar2);
            iVar4 = (int)uVar16;
            uVar14 = (ulong)(iVar6 - 1);
            if (iVar4 == 0) {
              uVar14 = uVar16 & 0xffffffff;
            }
            pwVar8 = pwVar8 + uVar14;
            uVar9 = uVar12 + 3 + iVar4;
            if (iVar4 == 0) {
              uVar9 = uVar12;
            }
          }
        }
      }
      pwVar8 = pwVar8 + 1;
      uVar12 = uVar9 + 1;
    } while (pwVar8 < pwVar1);
    pOVar15 = local_60;
    this = local_78;
    if (iVar5 <= (int)uVar9) {
      ON_wString(&local_88);
      pwVar8 = ReserveArray(&local_88,(ulong)uVar12);
      if (pwVar8 == (wchar_t *)0x0) {
        ON_wString(local_78,&EmptyString);
      }
      else {
        do {
          wVar13 = *sWideChar;
          *pwVar8 = wVar13;
          if (wVar13 < L'\'') {
            if (wVar13 == L'\"') {
              builtin_wcsncpy(pwVar8,L"&quot;",6);
              goto LAB_00682519;
            }
            if (wVar13 == L'&') {
              builtin_wcsncpy(pwVar8,L"&amp;",5);
              pwVar8 = pwVar8 + 5;
            }
            else {
LAB_00682522:
              if (0x7f < (uint)wVar13 && (in_DL ^ 1) == 0) {
                local_70.m_error_code_point =
                     ON_UnicodeErrorParameters::MaskErrors.m_error_code_point;
                local_70.m_error_status = ON_UnicodeErrorParameters::MaskErrors.m_error_status;
                local_70.m_error_mask = ON_UnicodeErrorParameters::MaskErrors.m_error_mask;
                local_7c = 0xfffd;
                iVar5 = ON_DecodeWideChar(sWideChar,
                                          (int)((ulong)((long)pwVar1 - (long)sWideChar) >> 2),
                                          &local_70,&local_7c);
                if ((0 < iVar5) && (iVar6 = ON_IsValidUnicodeCodePoint(local_7c), iVar6 != 0)) {
                  uVar16 = 0;
                  OVar10 = local_7c;
                  do {
                    if (uVar16 == 8) {
                      uVar16 = 0;
                      break;
                    }
                    local_58[uVar16] = OVar10 & 0xf;
                    uVar16 = uVar16 + 1;
                    bVar2 = 0xf < OVar10;
                    OVar10 = OVar10 >> 4;
                  } while (bVar2);
                  if ((int)uVar16 != 0) {
                    pwVar8[0] = L'&';
                    pwVar8[1] = L'#';
                    pwVar8[2] = L'x';
                    pwVar8 = pwVar8 + 3;
                    uVar16 = uVar16 & 0xffffffff;
                    do {
                      uVar9 = *(uint *)((long)&local_60 + uVar16 * 4 + 4);
                      wVar13 = uVar9 | 0x30;
                      if (9 < uVar9) {
                        wVar13 = uVar9 + L'W';
                      }
                      *pwVar8 = wVar13;
                      pwVar8 = pwVar8 + 1;
                      uVar16 = uVar16 - 1;
                    } while (uVar16 != 0);
                    *pwVar8 = L';';
                    sWideChar = sWideChar + (iVar5 - 1);
                  }
                }
              }
              pwVar8 = pwVar8 + 1;
            }
          }
          else if (wVar13 == L'\'') {
            builtin_wcsncpy(pwVar8,L"&apos;",6);
LAB_00682519:
            pwVar8 = pwVar8 + 6;
          }
          else {
            if (wVar13 == L'<') {
              builtin_wcsncpy(pwVar8,L"&lt;",4);
            }
            else {
              if (wVar13 != L'>') goto LAB_00682522;
              builtin_wcsncpy(pwVar8,L"&gt;",4);
            }
            pwVar8 = pwVar8 + 4;
          }
          sWideChar = sWideChar + 1;
        } while (sWideChar < pwVar1);
        *pwVar8 = L'\0';
        pOVar15 = &local_88;
        CopyArray(pOVar15);
        lVar3 = CONCAT44(local_88.m_s._4_4_,(uint)local_88.m_s);
        pOVar7 = (ON_Internal_Empty_wString *)(lVar3 + -0xc);
        if (lVar3 == 0) {
          pOVar7 = &empty_wstring;
        }
        lVar11 = 0;
        if (0 < (pOVar7->header).string_capacity) {
          lVar11 = lVar3;
        }
        uVar16 = (ulong)((long)pwVar8 - lVar11) >> 2;
        if (uVar12 == (uint)uVar16) {
          SetLength(pOVar15,uVar16 & 0xffffffff);
        }
        else {
          pOVar15 = &EmptyString;
        }
        ON_wString(local_78,pOVar15);
      }
      ~ON_wString(&local_88);
      return (ON_wString)(wchar_t *)local_78;
    }
  }
  ON_wString(this,pOVar15);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::EncodeXMLValue(
  bool bEncodeCodePointsAboveBasicLatin
) const
{
  const int length0 = this->Length();
  if (length0 <= 0)
    return ON_wString::EmptyString;

  const wchar_t* buffer0 = this->Array();
  if (nullptr == buffer0)
    return ON_wString::EmptyString;
  unsigned hex_digits[8] = {};
  const unsigned hex_digit_capacity = (unsigned)(sizeof(hex_digits) / sizeof(hex_digits[0]));

  const wchar_t* buffer0_end = buffer0 + length0;
  int length1 = 0;
  struct ON_UnicodeErrorParameters e;
  for (const wchar_t* buffer1 = buffer0; buffer1 < buffer0_end; ++buffer1, ++length1)
  {
    const wchar_t c = *buffer1;
    switch (c)
    {
    case ON_UnicodeCodePoint::ON_QuotationMark:
      length1 += 5;
      break;
    case ON_UnicodeCodePoint::ON_Ampersand:
      length1 += 4;
      break;
    case ON_UnicodeCodePoint::ON_Apostrophe:
      length1 += 5;
      break;
    case ON_UnicodeCodePoint::ON_LessThanSign:
      length1 += 3;
      break;
    case ON_UnicodeCodePoint::ON_GreaterThanSign:
      length1 += 3;
      break;
    default:
      if (bEncodeCodePointsAboveBasicLatin && (c < 0 || c > 127))
      {
        e = ON_UnicodeErrorParameters::MaskErrors;
        ON__UINT32 u = ON_UnicodeCodePoint::ON_ReplacementCharacter;
        const int decoded_wchar_count = ON_DecodeWideChar(buffer1, (int)(buffer0_end - buffer1), &e, &u);
        if (decoded_wchar_count > 0 && ON_IsValidUnicodeCodePoint(u))
        {
          const unsigned hex_digit_count = Internal_ToHexDigits(u, hex_digits, hex_digit_capacity);
          if (hex_digit_count > 0)
          {
            length1 += hex_digit_count;
            length1 += 3;
            buffer1 += (decoded_wchar_count-1);
          }
        }
      }
    break;
    }
  }

  if (length1 <= length0)
    return *this; // nothing to encode

  ON_wString s;
  wchar_t* encoded = s.ReserveArray(length1);
  if (nullptr == encoded)
    return ON_wString::EmptyString; // catastrophe

  for (const wchar_t* buffer1 = buffer0; buffer1 < buffer0_end; ++buffer1)
  {
    *encoded = *buffer1;
    switch (*encoded)
    {
    case ON_UnicodeCodePoint::ON_QuotationMark:
      *encoded++ = ON_wString::Ampersand;
      *encoded++ = 'q';
      *encoded++ = 'u';
      *encoded++ = 'o';
      *encoded++ = 't';
      *encoded++ = ON_wString::Semicolon;
      break;

    case ON_UnicodeCodePoint::ON_Ampersand:
      *encoded++ = ON_wString::Ampersand;
      *encoded++ = 'a';
      *encoded++ = 'm';
      *encoded++ = 'p';
      *encoded++ = ON_wString::Semicolon;
      break;

    case ON_UnicodeCodePoint::ON_Apostrophe:
      *encoded++ = ON_wString::Ampersand;
      *encoded++ = 'a';
      *encoded++ = 'p';
      *encoded++ = 'o';
      *encoded++ = 's';
      *encoded++ = ON_wString::Semicolon;
      break;

    case ON_UnicodeCodePoint::ON_LessThanSign:
      *encoded++ = ON_wString::Ampersand;
      *encoded++ = 'l';
      *encoded++ = 't';
      *encoded++ = ON_wString::Semicolon;
      break;

    case ON_UnicodeCodePoint::ON_GreaterThanSign:
      *encoded++ = ON_wString::Ampersand;
      *encoded++ = 'g';
      *encoded++ = 't';
      *encoded++ = ON_wString::Semicolon;
      break;

    default:
      if (bEncodeCodePointsAboveBasicLatin && (*encoded < 0 || *encoded > 127))
      {
        e = ON_UnicodeErrorParameters::MaskErrors;
        ON__UINT32 u = ON_UnicodeCodePoint::ON_ReplacementCharacter;
        const int decoded_wchar_count = ON_DecodeWideChar(buffer1, (int)(buffer0_end - buffer1), &e, &u);
        if (decoded_wchar_count > 0 && ON_IsValidUnicodeCodePoint(u))
        {
          unsigned hex_digit_count = Internal_ToHexDigits(u, hex_digits, hex_digit_capacity);
          if (hex_digit_count > 0)
          {
            *encoded++ = ON_wString::Ampersand;
            *encoded++ = ON_wString::NumberSign;
            *encoded++ = 'x';
            while(hex_digit_count>0)
            {
              --hex_digit_count;
              const unsigned h = hex_digits[hex_digit_count];
              if (h <= 9)
                *encoded++ = (wchar_t)('0' + h);
              else
                *encoded++ = (wchar_t)('a' + (h - 10));
            }
            *encoded = ON_wString::Semicolon;
            buffer1 += (decoded_wchar_count - 1);
          }
        }
      }
      ++encoded;
    }
  }
  *encoded = 0;
  const int encoded_length = (int)(encoded - s.Array());
  if (encoded_length == length1)
  {
    s.SetLength(encoded_length);
    return s;
  }

  return ON_wString::EmptyString; // catastrophe!
}